

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall
cmCTestConfigureCommand::InitializeHandler(cmCTestConfigureCommand *this)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  _Alloc_hider __haystack;
  bool bVar3;
  char *pcVar4;
  cmCTestGenericHandler *pcVar5;
  cmake *this_00;
  cmGlobalGenerator *pcVar6;
  ostream *poVar7;
  string *psVar8;
  pointer pbVar9;
  bool bVar10;
  string option;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  string cmakelists_file;
  string cmakeConfigureCommand;
  allocator local_255;
  uint local_254;
  string local_250;
  char *local_230;
  string local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  cmCommand *local_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostream local_1a8;
  
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar4 = (this->super_cmCTestHandlerCommand).Values.
           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start[6];
  if (pcVar4 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_1a8,pcVar4,(allocator *)&local_250);
    cmSystemTools::ExpandListArgument((string *)&local_1a8,&local_208,false);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_250,"BuildDirectory",(allocator *)&local_1c8);
  cmCTest::GetCTestConfiguration((string *)&local_1a8,pcVar1,&local_250);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_250);
  if (local_1a8._8_8_ == 0) {
    std::__cxx11::string::string
              ((string *)&local_1a8,
               "Build directory not specified. Either use BUILD argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY variable"
               ,(allocator *)&local_250);
    cmCommand::SetError((cmCommand *)this,(string *)&local_1a8);
LAB_002ff1f4:
    psVar8 = (string *)&local_1a8;
LAB_002ff1fc:
    std::__cxx11::string::~string((string *)psVar8);
  }
  else {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string
              ((string *)&local_1a8,"CTEST_CONFIGURE_COMMAND",(allocator *)&local_250);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
                 pcVar4,(this->super_cmCTestHandlerCommand).Quiet);
LAB_002ff010:
      pcVar5 = cmCTest::GetInitializedHandler
                         ((cmCTest *)
                          (((cmCommand *)((long)this + 0x50))->super_cmObject)._vptr_cmObject,
                          "configure");
      if (pcVar5 != (cmCTestGenericHandler *)0x0) {
        pcVar5->Quiet =
             *(bool *)((long)&(((cmCommand *)((long)this + 0x50))->Helper).Arguments.
                              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 1);
        goto LAB_002ff203;
      }
      std::__cxx11::string::string
                ((string *)&local_1a8,"internal CTest error. Cannot instantiate configure handler",
                 (allocator *)&local_250);
      cmCommand::SetError((cmCommand *)this,(string *)&local_1a8);
      goto LAB_002ff1f4;
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string
              ((string *)&local_1a8,"CTEST_CMAKE_GENERATOR",(allocator *)&local_250);
    pcVar4 = cmMakefile::GetDefinition(pcVar2,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
      std::__cxx11::string::string
                ((string *)&local_1a8,
                 "Configure command is not specified. If this is a \"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, set CTEST_CONFIGURE_COMMAND."
                 ,(allocator *)&local_250);
      cmCommand::SetError((cmCommand *)this,(string *)&local_1a8);
      goto LAB_002ff1f4;
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::string::string((string *)&local_1a8,"SourceDirectory",(allocator *)&local_1c8);
    cmCTest::GetCTestConfiguration(&local_250,pcVar1,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if (local_250._M_string_length == 0) {
      std::__cxx11::string::string
                ((string *)&local_1a8,
                 "Source directory not specified. Either use SOURCE argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY variable"
                 ,(allocator *)&local_1c8);
      cmCommand::SetError((cmCommand *)this,(string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      psVar8 = &local_250;
      goto LAB_002ff1fc;
    }
    local_230 = pcVar4;
    std::operator+(&local_1c8,&local_250,"/CMakeLists.txt");
    bVar3 = cmsys::SystemTools::FileExists(local_1c8._M_dataplus._M_p);
    if (bVar3) {
      this_00 = cmMakefile::GetCMakeInstance
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                           Makefile);
      std::__cxx11::string::string((string *)&local_1a8,local_230,(allocator *)&local_228);
      pcVar6 = cmake::CreateGlobalGenerator(this_00,(string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      if (pcVar6 == (cmGlobalGenerator *)0x0) {
        local_254 = 0;
      }
      else {
        local_254 = (*pcVar6->_vptr_cmGlobalGenerator[0x1b])(pcVar6);
        (*pcVar6->_vptr_cmGlobalGenerator[1])(pcVar6);
      }
      std::__cxx11::string::string((string *)&local_1a8,"\"",(allocator *)&local_228);
      local_1f0 = (cmCommand *)this;
      cmSystemTools::GetCMakeCommand_abi_cxx11_();
      std::__cxx11::string::append((string *)&local_1a8);
      std::__cxx11::string::append((char *)&local_1a8);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      local_228._M_string_length = 0;
      local_228.field_2._M_local_buf[0] = '\0';
      bVar10 = false;
      for (pbVar9 = local_208.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          this = (cmCTestConfigureCommand *)local_1f0,
          pbVar9 != local_208.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
        std::__cxx11::string::_M_assign((string *)&local_228);
        std::__cxx11::string::append((char *)&local_1a8);
        std::__cxx11::string::append((string *)&local_1a8);
        std::__cxx11::string::append((char *)&local_1a8);
        __haystack._M_p = local_228._M_dataplus._M_p;
        pcVar4 = strstr(local_228._M_dataplus._M_p,"CMAKE_BUILD_TYPE=");
        if ((pcVar4 != (char *)0x0) ||
           (pcVar4 = strstr(__haystack._M_p,"CMAKE_BUILD_TYPE:STRING="), pcVar4 != (char *)0x0)) {
          bVar10 = true;
        }
      }
      if (((local_254 & 1) == 0 && !bVar10) &&
         (psVar8 = cmCTest::GetConfigType_abi_cxx11_
                             ((cmCTest *)local_1f0[1].super_cmObject._vptr_cmObject),
         psVar8->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)&local_1a8);
        cmCTest::GetConfigType_abi_cxx11_
                  ((cmCTest *)(((cmCommand *)((long)this + 0x50))->super_cmObject)._vptr_cmObject);
        std::__cxx11::string::append((string *)&local_1a8);
        std::__cxx11::string::append((char *)&local_1a8);
      }
      std::__cxx11::string::append((char *)&local_1a8);
      std::__cxx11::string::append((char *)&local_1a8);
      std::__cxx11::string::append((char *)&local_1a8);
      pcVar2 = ((cmCommand *)this)->Makefile;
      std::__cxx11::string::string((string *)&local_1e8,"CTEST_CMAKE_GENERATOR_PLATFORM",&local_255)
      ;
      pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
        std::__cxx11::string::append((char *)&local_1a8);
        std::__cxx11::string::append((char *)&local_1a8);
        std::__cxx11::string::append((char *)&local_1a8);
      }
      pcVar2 = ((cmCommand *)this)->Makefile;
      std::__cxx11::string::string((string *)&local_1e8,"CTEST_CMAKE_GENERATOR_TOOLSET",&local_255);
      pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
        std::__cxx11::string::append((char *)&local_1a8);
        std::__cxx11::string::append((char *)&local_1a8);
        std::__cxx11::string::append((char *)&local_1a8);
      }
      std::__cxx11::string::append((char *)&local_1a8);
      std::__cxx11::string::append((string *)&local_1a8);
      std::__cxx11::string::append((char *)&local_1a8);
      cmCTest::SetCTestConfiguration
                ((cmCTest *)(((cmCommand *)((long)this + 0x50))->super_cmObject)._vptr_cmObject,
                 "ConfigureCommand",(char *)local_1a8._vptr_basic_ostream,
                 *(bool *)((long)&(((cmCommand *)((long)this + 0x50))->Helper).Arguments.
                                  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 1));
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar7 = std::operator<<(&local_1a8,"CMakeLists.txt file does not exist [");
      poVar7 = std::operator<<(poVar7,(string *)&local_1c8);
      std::operator<<(poVar7,"]");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError((cmCommand *)this,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    }
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_250);
    if (bVar3) goto LAB_002ff010;
  }
  pcVar5 = (cmCTestGenericHandler *)0x0;
LAB_002ff203:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  return pcVar5;
}

Assistant:

cmCTestGenericHandler* cmCTestConfigureCommand::InitializeHandler()
{
  std::vector<std::string> options;

  if (this->Values[ctc_OPTIONS])
    {
    cmSystemTools::ExpandListArgument(this->Values[ctc_OPTIONS], options);
    }

  if ( this->CTest->GetCTestConfiguration("BuildDirectory").empty() )
    {
    this->SetError("Build directory not specified. Either use BUILD "
      "argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY "
      "variable");
    return 0;
    }

  const char* ctestConfigureCommand
    = this->Makefile->GetDefinition("CTEST_CONFIGURE_COMMAND");

  if ( ctestConfigureCommand && *ctestConfigureCommand )
    {
    this->CTest->SetCTestConfiguration("ConfigureCommand",
      ctestConfigureCommand, this->Quiet);
    }
  else
    {
    const char* cmakeGeneratorName
      = this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    if ( cmakeGeneratorName && *cmakeGeneratorName )
      {
      const std::string& source_dir
        = this->CTest->GetCTestConfiguration("SourceDirectory");
      if ( source_dir.empty() )
        {
        this->SetError("Source directory not specified. Either use SOURCE "
          "argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY "
          "variable");
        return 0;
        }

      const std::string cmakelists_file = source_dir + "/CMakeLists.txt";
      if ( !cmSystemTools::FileExists(cmakelists_file.c_str()) )
        {
        std::ostringstream e;
        e << "CMakeLists.txt file does not exist ["
          << cmakelists_file << "]";
        this->SetError(e.str());
        return 0;
        }

      bool multiConfig = false;
      bool cmakeBuildTypeInOptions = false;

      cmGlobalGenerator *gg =
        this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
          cmakeGeneratorName);
      if(gg)
        {
        multiConfig = gg->IsMultiConfig();
        delete gg;
        }

      std::string cmakeConfigureCommand = "\"";
      cmakeConfigureCommand += cmSystemTools::GetCMakeCommand();
      cmakeConfigureCommand += "\"";

      std::vector<std::string>::const_iterator it;
      std::string option;
      for (it= options.begin(); it!=options.end(); ++it)
        {
        option = *it;

        cmakeConfigureCommand += " \"";
        cmakeConfigureCommand += option;
        cmakeConfigureCommand += "\"";

        if ((0 != strstr(option.c_str(), "CMAKE_BUILD_TYPE=")) ||
           (0 != strstr(option.c_str(), "CMAKE_BUILD_TYPE:STRING=")))
          {
          cmakeBuildTypeInOptions = true;
          }
        }

      if (!multiConfig && !cmakeBuildTypeInOptions &&
          !this->CTest->GetConfigType().empty())
        {
        cmakeConfigureCommand += " \"-DCMAKE_BUILD_TYPE:STRING=";
        cmakeConfigureCommand += this->CTest->GetConfigType();
        cmakeConfigureCommand += "\"";
        }

      cmakeConfigureCommand += " \"-G";
      cmakeConfigureCommand += cmakeGeneratorName;
      cmakeConfigureCommand += "\"";

      const char* cmakeGeneratorPlatform =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_PLATFORM");
      if(cmakeGeneratorPlatform && *cmakeGeneratorPlatform)
        {
        cmakeConfigureCommand += " \"-A";
        cmakeConfigureCommand += cmakeGeneratorPlatform;
        cmakeConfigureCommand += "\"";
        }

      const char* cmakeGeneratorToolset =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_TOOLSET");
      if(cmakeGeneratorToolset && *cmakeGeneratorToolset)
        {
        cmakeConfigureCommand += " \"-T";
        cmakeConfigureCommand += cmakeGeneratorToolset;
        cmakeConfigureCommand += "\"";
        }

      cmakeConfigureCommand += " \"";
      cmakeConfigureCommand += source_dir;
      cmakeConfigureCommand += "\"";

      this->CTest->SetCTestConfiguration("ConfigureCommand",
        cmakeConfigureCommand.c_str(), this->Quiet);
      }
    else
      {
      this->SetError("Configure command is not specified. If this is a "
        "\"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, "
        "set CTEST_CONFIGURE_COMMAND.");
      return 0;
      }
    }

  cmCTestGenericHandler* handler
    = this->CTest->GetInitializedHandler("configure");
  if ( !handler )
    {
    this->SetError(
      "internal CTest error. Cannot instantiate configure handler");
    return 0;
    }
  handler->SetQuiet(this->Quiet);
  return handler;
}